

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O2

bool jessilib::apply_cpp_escape_sequences<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inout_string)

{
  char cVar1;
  char32_t *pcVar2;
  char *in_RDX;
  char *extraout_RDX;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  decode_result dVar6;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  char *write_head;
  basic_string_view<char,_std::char_traits<char>_> read_view;
  
  read_view._M_len = inout_string->_M_string_length;
  if (read_view._M_len == 0) {
    bVar5 = true;
  }
  else {
    write_head = (inout_string->_M_dataplus)._M_p;
    read_view._M_str = write_head;
    do {
      while( true ) {
        in_string._M_str = in_RDX;
        in_string._M_len = (size_t)read_view._M_str;
        dVar6 = decode_codepoint_utf8<char>((jessilib *)read_view._M_len,in_string);
        in_RDX = (char *)dVar6.units;
        bVar5 = in_RDX == (char *)0x0;
        if (bVar5) goto LAB_00373c90;
        pcVar2 = L"\\";
        uVar4 = 1;
        while (uVar3 = uVar4, 0 < (long)uVar3) {
          uVar4 = uVar3 >> 1;
          if ((uint)pcVar2[uVar4 * 4] < (uint)dVar6.codepoint) {
            pcVar2 = pcVar2 + uVar4 * 4 + 4;
            uVar4 = ~uVar4 + uVar3;
          }
        }
        if ((pcVar2 != L"\n") && (*pcVar2 == dVar6.codepoint)) break;
        while (bVar5 = in_RDX != (char *)0x0, in_RDX = in_RDX + -1, bVar5) {
          *write_head = *read_view._M_str;
          write_head = write_head + 1;
          read_view._M_str = read_view._M_str + 1;
          read_view._M_len = read_view._M_len - 1;
        }
      }
      read_view._M_str = read_view._M_str + (long)in_RDX;
      read_view._M_len = read_view._M_len - (long)in_RDX;
      cVar1 = (**(code **)(pcVar2 + 2))(&write_head,&read_view);
      in_RDX = extraout_RDX;
    } while (cVar1 != '\0');
LAB_00373c90:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (inout_string,(long)write_head - (long)(inout_string->_M_dataplus)._M_p,
               0xffffffffffffffff);
  }
  return bVar5;
}

Assistant:

constexpr bool apply_cpp_escape_sequences(std::basic_string<CharT>& inout_string) {
	static_assert(is_sorted<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(), "Tree must be pre-sorted");
	static_assert(is_sorted<CharT, cpp_escapes_main_tree<CharT>, std::size(cpp_escapes_main_tree<CharT>)>(), "Tree must be pre-sorted");

	return apply_shrink_sequence_tree<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(inout_string);
}